

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_algorithm_unittest.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SignatureAlgorithmTest_ParseDerMd5WithRsaEncryptionNullParams_Test::TestBody
          (SignatureAlgorithmTest_ParseDerMd5WithRsaEncryptionNullParams_Test *this)

{
  optional<bssl::SignatureAlgorithm> oVar1;
  pointer *__ptr;
  char *in_R9;
  Input algorithm_identifier;
  AssertionResult gtest_ar_;
  uint8_t kData [15];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  string local_40;
  uchar local_20 [16];
  
  local_20[8] = 0xf7;
  local_20[9] = '\r';
  local_20[10] = '\x01';
  local_20[0xb] = '\x01';
  local_20[0xc] = '\x04';
  local_20[0xd] = '\x05';
  local_20[0xe] = '\0';
  local_20[0] = '0';
  local_20[1] = '\r';
  local_20[2] = '\x06';
  local_20[3] = '\t';
  local_20[4] = '*';
  local_20[5] = 0x86;
  local_20[6] = 'H';
  local_20[7] = 0x86;
  algorithm_identifier.data_.size_ = 0xf;
  algorithm_identifier.data_.data_ = local_20;
  oVar1 = ParseSignatureAlgorithm(algorithm_identifier);
  local_50[0] = (internal)
                (((ulong)oVar1.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload
                         .super__Optional_payload_base<bssl::SignatureAlgorithm> >> 0x20 & 1) == 0);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_50[0]) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,local_50,(AssertionResult *)"ParseSignatureAlgorithm(der::Input(kData))",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/signature_algorithm_unittest.cc"
               ,0x55f,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  return;
}

Assistant:

TEST(SignatureAlgorithmTest, ParseDerMd5WithRsaEncryptionNullParams) {
  // clang-format off
  const uint8_t kData[] = {
      0x30, 0x0D,  // SEQUENCE (13 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x2A, 0x86, 0x48, 0x86, 0xF7, 0x0D, 0x01, 0x01, 0x04,
      0x05, 0x00,  // NULL (0 bytes)
  };
  // clang-format on
  EXPECT_FALSE(ParseSignatureAlgorithm(der::Input(kData)));
}